

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertors.h
# Opt level: O2

bool FIX::BoolConvertor::convert(string *value,bool *result)

{
  char cVar1;
  bool bVar2;
  
  if (value->_M_string_length != 1) {
    return false;
  }
  cVar1 = *(value->_M_dataplus)._M_p;
  bVar2 = true;
  if (cVar1 != 'Y') {
    if (cVar1 != 'N') {
      return false;
    }
    bVar2 = false;
  }
  *result = bVar2;
  return true;
}

Assistant:

static bool convert( const std::string& value, bool& result )
  {
    if( value.size() != 1 ) return false;
    switch( value[0] )
    {
      case 'Y': result = true; break;
      case 'N': result = false; break;
      default: return false;
    }

    return true;
  }